

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_div_q_2exp(__mpz_struct *q,__mpz_struct *u,mp_bitcnt_t bit_index,mpz_div_round_mode mode)

{
  ulong *puVar1;
  uint uVar2;
  mp_limb_t *pmVar3;
  uint uVar4;
  mp_ptr pmVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long size;
  mp_ptr pmVar10;
  mp_limb_t mVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar2 = u->_mp_size;
  if (uVar2 == 0) {
    q->_mp_size = 0;
    return;
  }
  uVar12 = bit_index >> 6;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  size = uVar4 - uVar12;
  bVar6 = (byte)bit_index & 0x3f;
  bVar13 = true;
  if (0 < (int)uVar2 == mode) {
    if (0 < size) {
      uVar7 = uVar12;
      if (0x3f < bit_index) {
        do {
          if (u->_mp_d[uVar7 - 1] != 0) goto LAB_005ea4d8;
          bVar13 = 1 < (long)uVar7;
          uVar7 = uVar7 - 1;
        } while (bVar13);
        uVar7 = 0;
      }
LAB_005ea4d8:
      if (uVar7 == 0) {
        bVar13 = (u->_mp_d[uVar12] & ~(-1L << bVar6)) == 0;
        goto LAB_005ea505;
      }
    }
    bVar13 = false;
  }
LAB_005ea505:
  if (size < 1) {
    iVar9 = 0;
  }
  else {
    if (q->_mp_alloc < size) {
      pmVar5 = mpz_realloc(q,size);
    }
    else {
      pmVar5 = q->_mp_d;
    }
    pmVar3 = u->_mp_d;
    puVar1 = pmVar3 + uVar12;
    if ((bit_index & 0x3f) == 0) {
      lVar8 = 0;
      do {
        pmVar5[lVar8] = puVar1[lVar8];
        lVar8 = lVar8 + 1;
      } while (size != lVar8);
    }
    else {
      mVar11 = *puVar1 >> bVar6;
      pmVar10 = pmVar5;
      if (size != 1) {
        uVar12 = uVar12 + 1;
        do {
          uVar7 = pmVar3[uVar12];
          *pmVar10 = uVar7 << (0x40 - bVar6 & 0x3f) | mVar11;
          mVar11 = uVar7 >> bVar6;
          pmVar10 = pmVar10 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
      }
      *pmVar10 = mVar11;
      size = size - (ulong)(pmVar5[size + -1] == 0);
    }
    iVar9 = (int)size;
  }
  q->_mp_size = iVar9;
  if (!bVar13) {
    mpz_add_ui(q,q,1);
  }
  if ((int)uVar2 < 0) {
    q->_mp_size = -q->_mp_size;
  }
  return;
}

Assistant:

static void
mpz_div_q_2exp (mpz_t q, const mpz_t u, mp_bitcnt_t bit_index,
		enum mpz_div_round_mode mode)
{
  mp_size_t un, qn;
  mp_size_t limb_cnt;
  mp_ptr qp;
  int adjust;

  un = u->_mp_size;
  if (un == 0)
    {
      q->_mp_size = 0;
      return;
    }
  limb_cnt = bit_index / GMP_LIMB_BITS;
  qn = GMP_ABS (un) - limb_cnt;
  bit_index %= GMP_LIMB_BITS;

  if (mode == ((un > 0) ? GMP_DIV_CEIL : GMP_DIV_FLOOR)) /* un != 0 here. */
    /* Note: Below, the final indexing at limb_cnt is valid because at
       that point we have qn > 0. */
    adjust = (qn <= 0
	      || !mpn_zero_p (u->_mp_d, limb_cnt)
	      || (u->_mp_d[limb_cnt]
		  & (((mp_limb_t) 1 << bit_index) - 1)));
  else
    adjust = 0;

  if (qn <= 0)
    qn = 0;
  else
    {
      qp = MPZ_REALLOC (q, qn);

      if (bit_index != 0)
	{
	  mpn_rshift (qp, u->_mp_d + limb_cnt, qn, bit_index);
	  qn -= qp[qn - 1] == 0;
	}
      else
	{
	  mpn_copyi (qp, u->_mp_d + limb_cnt, qn);
	}
    }

  q->_mp_size = qn;

  if (adjust)
    mpz_add_ui (q, q, 1);
  if (un < 0)
    mpz_neg (q, q);
}